

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_InvalidFieldMapWithMessageEncoding_Test::
~FeaturesTest_InvalidFieldMapWithMessageEncoding_Test
          (FeaturesTest_InvalidFieldMapWithMessageEncoding_Test *this)

{
  FeaturesTest_InvalidFieldMapWithMessageEncoding_Test *this_local;
  
  ~FeaturesTest_InvalidFieldMapWithMessageEncoding_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(FeaturesTest, InvalidFieldMapWithMessageEncoding) {
  constexpr absl::string_view kProtoFile = R"schema(
    edition = "2023";

    message Foo {
      map<string, Foo> bar = 1 [
        features.message_encoding = DELIMITED
      ];
    }
  )schema";
  io::ArrayInputStream input_stream(kProtoFile.data(), kProtoFile.size());
  SimpleErrorCollector error_collector;
  io::Tokenizer tokenizer(&input_stream, &error_collector);
  compiler::Parser parser;
  parser.RecordErrorsTo(&error_collector);
  FileDescriptorProto proto;
  ASSERT_TRUE(parser.Parse(&tokenizer, &proto))
      << error_collector.last_error() << "\n"
      << kProtoFile;
  ASSERT_EQ("", error_collector.last_error());
  proto.set_name("foo.proto");

  BuildDescriptorMessagesInTestPool();
  BuildFileWithErrors(
      proto,
      "foo.proto: Foo.bar: NAME: Only message fields can specify message "
      "encoding.\n");
}